

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPartHelper.cpp
# Opt level: O0

void anon_unknown.dwarf_1e3d60::testMultiView(void)

{
  MultiViewChannelName chans [20];
  MultiViewChannelName *in_stack_fffffffffffff640;
  MultiViewChannelName **in_stack_fffffffffffff658;
  MultiViewChannelName **in_stack_fffffffffffff660;
  string *psVar1;
  string *local_998;
  allocator<char> *in_stack_fffffffffffff670;
  allocator<char> *__a;
  char *in_stack_fffffffffffff678;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *local_960;
  allocator<char> local_941;
  string local_940 [32];
  string *local_920;
  string *local_918;
  string *local_910;
  string *local_908;
  allocator<char> local_8f9;
  string local_8f8 [32];
  string *local_8d8;
  string *local_8d0;
  string *local_8c8;
  string *local_8c0;
  undefined1 local_8b1 [33];
  string *local_890;
  string *local_888;
  string *local_880;
  string *local_878;
  allocator<char> local_869;
  string local_868 [32];
  string *local_848;
  string *local_840;
  string local_828 [32];
  string local_808 [72];
  string local_7c0 [32];
  string local_7a0 [72];
  string local_758 [32];
  string local_738 [72];
  string local_6f0 [32];
  string local_6d0 [72];
  string local_688 [8];
  string *in_stack_fffffffffffff980;
  undefined1 in_stack_fffffffffffff98f;
  MultiViewChannelName **in_stack_fffffffffffff990;
  MultiViewChannelName **in_stack_fffffffffffff998;
  string local_620 [32];
  string local_600 [72];
  string local_5b8 [32];
  string local_598 [72];
  string local_550 [32];
  string local_530 [72];
  string local_4e8 [32];
  string local_4c8 [72];
  string local_480 [32];
  string local_460 [72];
  string local_418 [32];
  string local_3f8 [72];
  string local_3b0 [32];
  string local_390 [72];
  string local_348 [32];
  string local_328 [72];
  string local_2e0 [32];
  string local_2c0 [72];
  string local_278 [32];
  string local_258 [72];
  string local_210 [32];
  string local_1f0 [72];
  string local_1a8 [32];
  string local_188 [72];
  string local_140 [32];
  string local_120 [72];
  string local_d8 [32];
  string local_b8 [72];
  string local_70 [32];
  string local_50 [72];
  string local_8 [8];
  
  local_960 = local_828;
  do {
    Imf_3_2::MultiViewChannelName::MultiViewChannelName(in_stack_fffffffffffff640);
    local_960 = local_960 + 0x68;
  } while (local_960 != local_8);
  std::__cxx11::string::operator=(local_828,"bob.one");
  std::__cxx11::string::operator=(local_808,"left");
  std::__cxx11::string::operator=(local_7c0,"bob.two");
  std::__cxx11::string::operator=(local_7a0,"left");
  std::__cxx11::string::operator=(local_758,"fred.one");
  std::__cxx11::string::operator=(local_738,"right");
  std::__cxx11::string::operator=(local_6f0,"fred.one");
  std::__cxx11::string::operator=(local_6d0,"left");
  std::__cxx11::string::operator=(local_688,"fred.two");
  std::__cxx11::string::operator=((string *)&stack0xfffffffffffff998,"left");
  std::__cxx11::string::operator=(local_620,"fred.two");
  std::__cxx11::string::operator=(local_600,"right");
  std::__cxx11::string::operator=(local_5b8,"R");
  std::__cxx11::string::operator=(local_598,"left");
  std::__cxx11::string::operator=(local_550,"R");
  std::__cxx11::string::operator=(local_530,"right");
  std::__cxx11::string::operator=(local_4e8,"G");
  std::__cxx11::string::operator=(local_4c8,"right");
  std::__cxx11::string::operator=(local_480,"G");
  std::__cxx11::string::operator=(local_460,"left");
  std::__cxx11::string::operator=(local_418,"B");
  std::__cxx11::string::operator=(local_3f8,"left");
  std::__cxx11::string::operator=(local_3b0,"B");
  std::__cxx11::string::operator=(local_390,"right");
  std::__cxx11::string::operator=(local_348,"multiple.layers.in.name");
  std::__cxx11::string::operator=(local_328,"left");
  std::__cxx11::string::operator=(local_2e0,"multiple.layers.in.name");
  std::__cxx11::string::operator=(local_2c0,"right");
  std::__cxx11::string::operator=(local_278,"multiple.layers.in.othername");
  std::__cxx11::string::operator=(local_258,"left");
  std::__cxx11::string::operator=(local_210,"multiple.layers.in.othername");
  std::__cxx11::string::operator=(local_1f0,"right");
  std::__cxx11::string::operator=(local_1a8,"multiple.layers.different.name");
  std::__cxx11::string::operator=(local_188,"left");
  std::__cxx11::string::operator=(local_140,"multiple.layers.different.name");
  std::__cxx11::string::operator=(local_120,"right");
  std::__cxx11::string::operator=(local_d8,"multiple.layers.different.othername");
  std::__cxx11::string::operator=(local_b8,"left");
  std::__cxx11::string::operator=(local_70,"multiple.layers.different.othername");
  std::__cxx11::string::operator=(local_50,"right");
  std::operator<<((ostream *)&std::cout,"multiview, hero left, single part:\n");
  local_840 = local_828;
  local_848 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff680,in_stack_fffffffffffff678,in_stack_fffffffffffff670);
  Imf_3_2::SplitChannels<Imf_3_2::MultiViewChannelName*>
            (in_stack_fffffffffffff998,in_stack_fffffffffffff990,(bool)in_stack_fffffffffffff98f,
             in_stack_fffffffffffff980);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator(&local_869);
  local_878 = local_828;
  local_880 = local_8;
  (anonymous_namespace)::print<Imf_3_2::MultiViewChannelName*>
            (in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  std::operator<<((ostream *)&std::cout,"multiview, hero left, multipart:\n");
  local_888 = local_828;
  local_890 = local_8;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffff678,in_stack_fffffffffffff670);
  Imf_3_2::SplitChannels<Imf_3_2::MultiViewChannelName*>
            (in_stack_fffffffffffff998,in_stack_fffffffffffff990,(bool)in_stack_fffffffffffff98f,
             in_stack_fffffffffffff980);
  std::__cxx11::string::~string((string *)(local_8b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_8b1);
  local_8c0 = local_828;
  local_8c8 = local_8;
  (anonymous_namespace)::print<Imf_3_2::MultiViewChannelName*>
            (in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  std::operator<<((ostream *)&std::cout,"multiview, hero right, single part:\n");
  local_8d0 = local_828;
  local_8d8 = local_8;
  __s = &local_8f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,in_stack_fffffffffffff670);
  Imf_3_2::SplitChannels<Imf_3_2::MultiViewChannelName*>
            (in_stack_fffffffffffff998,in_stack_fffffffffffff990,(bool)in_stack_fffffffffffff98f,
             in_stack_fffffffffffff980);
  std::__cxx11::string::~string(local_8f8);
  std::allocator<char>::~allocator(&local_8f9);
  local_908 = local_828;
  local_910 = local_8;
  (anonymous_namespace)::print<Imf_3_2::MultiViewChannelName*>
            (in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  std::operator<<((ostream *)&std::cout,"multiview, hero right, multipart:\n");
  local_918 = local_828;
  local_920 = local_8;
  __a = &local_941;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  Imf_3_2::SplitChannels<Imf_3_2::MultiViewChannelName*>
            (in_stack_fffffffffffff998,in_stack_fffffffffffff990,(bool)in_stack_fffffffffffff98f,
             in_stack_fffffffffffff980);
  std::__cxx11::string::~string(local_940);
  std::allocator<char>::~allocator(&local_941);
  (anonymous_namespace)::print<Imf_3_2::MultiViewChannelName*>
            (in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  psVar1 = local_828;
  local_998 = local_8;
  do {
    local_998 = local_998 + -0x68;
    Imf_3_2::MultiViewChannelName::~MultiViewChannelName(in_stack_fffffffffffff640);
  } while (local_998 != psVar1);
  return;
}

Assistant:

void
testMultiView ()
{
    MultiViewChannelName chans[20];
    // Bob layer, only in left
    chans[0].name = "bob.one";
    chans[0].view = "left";
    chans[1].name = "bob.two";
    chans[1].view = "left";

    chans[2].name = "fred.one";
    chans[2].view = "right";
    chans[3].name = "fred.one";
    chans[3].view = "left";
    chans[4].name = "fred.two";
    chans[4].view = "left";
    chans[5].name = "fred.two";
    chans[5].view = "right";

    chans[6].name = "R";
    chans[6].view = "left";
    chans[7].name = "R";
    chans[7].view = "right";

    chans[8].name = "G";
    chans[8].view = "right";
    chans[9].name = "G";
    chans[9].view = "left";

    chans[10].name = "B";
    chans[10].view = "left";
    chans[11].name = "B";
    chans[11].view = "right";

    chans[12].name = "multiple.layers.in.name";
    chans[12].view = "left";
    chans[13].name = "multiple.layers.in.name";
    chans[13].view = "right";

    chans[14].name = "multiple.layers.in.othername";
    chans[14].view = "left";
    chans[15].name = "multiple.layers.in.othername";
    chans[15].view = "right";

    chans[16].name = "multiple.layers.different.name";
    chans[16].view = "left";
    chans[17].name = "multiple.layers.different.name";
    chans[17].view = "right";

    chans[18].name = "multiple.layers.different.othername";
    chans[18].view = "left";
    chans[19].name = "multiple.layers.different.othername";
    chans[19].view = "right";

    cout << "multiview, hero left, single part:\n";
    SplitChannels (chans + 0, chans + 20, false, "left");
    print (chans + 0, chans + 20);

    cout << "multiview, hero left, multipart:\n";
    SplitChannels (chans + 0, chans + 20, true, "left");
    print (chans + 0, chans + 20);

    cout << "multiview, hero right, single part:\n";
    SplitChannels (chans + 0, chans + 20, false, "right");
    print (chans + 0, chans + 20);

    cout << "multiview, hero right, multipart:\n";
    SplitChannels (chans + 0, chans + 20, true, "right");
    print (chans + 0, chans + 20);
}